

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.h
# Opt level: O3

void __thiscall Sphere::Sphere(Sphere *this,Vector3f *center,float radius,Material *material)

{
  (this->super_Object3D).type._M_dataplus._M_p = (pointer)&(this->super_Object3D).type.field_2;
  (this->super_Object3D).type._M_string_length = 0;
  (this->super_Object3D).type.field_2._M_local_buf[0] = '\0';
  (this->super_Object3D).material = material;
  (this->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Object3D_0013f9c0;
  Vector3f::Vector3f(&this->_center,center);
  this->_radius = radius;
  return;
}

Assistant:

Sphere(const Vector3f &center,
           float radius,
           Material *material) :
            Object3D(material),
            _center(center),
            _radius(radius) {
    }